

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
PyreNet::NeuralNet::predict
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NeuralNet *this,
          vector<double,_std::allocator<double>_> *input)

{
  pointer pLVar1;
  pointer pdVar2;
  pointer pdVar3;
  undefined8 *puVar4;
  pointer_____offset_0x10___ *ppuVar5;
  Layer *l;
  pointer this_00;
  vector<double,_std::allocator<double>_> local_48;
  
  if (((this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
       super__Vector_impl_data._M_start) || (this->inputSize == 0)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = &PTR__exception_0010cd20;
    ppuVar5 = &InvalidNetworkSize::typeinfo;
  }
  else {
    if ((long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == (long)this->inputSize) {
      std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,input);
      this_00 = (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pLVar1 = (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (this_00 != pLVar1) {
        do {
          Layer::calculate(&local_48,this_00,__return_storage_ptr__);
          pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (pdVar2 != (pointer)0x0) {
            operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
            if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          this_00 = this_00 + 1;
        } while (this_00 != pLVar1);
      }
      return __return_storage_ptr__;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = &PTR__exception_0010cca0;
    ppuVar5 = &InvalidInputSize::typeinfo;
  }
  __cxa_throw(puVar4,ppuVar5,std::exception::~exception);
}

Assistant:

std::vector<double> NeuralNet::predict(const std::vector<double> &input) {
        if (this->layers.size() == 0 || this->inputSize == 0) throw InvalidNetworkSize();
        if (input.size() != this->inputSize) throw InvalidInputSize();
        std::vector<double> layerData(input);
        for (Layer &l : this->layers) {
            layerData = l.calculate(layerData);
        }
        return layerData;
    }